

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O0

ssize_t __thiscall Samba::write(Samba *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  pointer pSVar2;
  SambaError *this_00;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t sVar3;
  char local_38 [8];
  uint8_t cmd [20];
  int size_local;
  uint8_t *buffer_local;
  uint32_t addr_local;
  Samba *this_local;
  
  cmd._12_4_ = (undefined4)__n;
  unique0x1000016d = (uint8_t *)__buf;
  if ((this->_debug & 1U) != 0) {
    printf("%s(addr=%#x,size=%#x)\n","write",(ulong)(uint)__fd,__n & 0xffffffff);
  }
  snprintf(local_38,0x14,"S%08X,%08X#",(ulong)(uint)__fd,(ulong)(uint)cmd._12_4_);
  pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  iVar1 = (*pSVar2->_vptr_SerialPort[6])(pSVar2,local_38,0x13);
  if (iVar1 != 0x13) {
    this_00 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(this_00);
    __cxa_throw(this_00,&SambaError::typeinfo,SambaError::~SambaError);
  }
  if ((this->_isUsb & 1U) == 0) {
    writeXmodem(this,stack0xffffffffffffffe0,cmd._12_4_);
    sVar3 = extraout_RAX_00;
  }
  else {
    pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    (*pSVar2->_vptr_SerialPort[10])();
    writeBinary(this,stack0xffffffffffffffe0,cmd._12_4_);
    sVar3 = extraout_RAX;
  }
  return sVar3;
}

Assistant:

void
Samba::write(uint32_t addr, const uint8_t* buffer, int size)
{
    uint8_t cmd[20];

    if (_debug)
        printf("%s(addr=%#x,size=%#x)\n", __FUNCTION__, addr, size);

    snprintf((char*) cmd, sizeof(cmd), "S%08X,%08X#", addr, size);
    if (_port->write(cmd, sizeof(cmd) - 1) != sizeof(cmd) - 1)
        throw SambaError();

    // The SAM firmware has a bug that if the command and binary data
    // are received in the same USB data packet, then the firmware
    // gets confused.  Even though the writes are separated in the code,
    // USB drivers often do write combining which can put them together
    // in the same USB data packet.  To avoid this, we call the serial
    // port object's flush method before writing the data.
    if (_isUsb)
    {
        _port->flush();
        writeBinary(buffer, size);
    }
    else
    {
        writeXmodem(buffer, size);
    }
}